

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar4;
  UtestShell *pUVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var_02;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_58);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))((long *)CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_58);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
            ((long *)CONCAT44(extraout_var_00,iVar1));
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_58);
  SimpleString::SimpleString(&local_28,"p2");
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar1),&local_28,2);
  SimpleString::SimpleString(&local_38,"p3");
  plVar4 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4,&local_38,3);
  SimpleString::SimpleString(&local_48,"p4");
  (**(code **)(*plVar4 + 0x40))(plVar4,&local_48,4);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_68);
  pUVar5 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x26])(pMVar3);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,(ulong)(uVar2 & 0xff),"LONGS_EQUAL(1, mock().expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x247,pTVar6);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_58);
  SimpleString::SimpleString(&local_28,"p2");
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_02,iVar1),&local_28,2);
  SimpleString::SimpleString(&local_38,"p3");
  plVar4 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4,&local_38,3);
  SimpleString::SimpleString(&local_48,"p4");
  (**(code **)(*plVar4 + 0x40))(plVar4,&local_48,4);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_68);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCalls)
{
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);
    LONGS_EQUAL(1, mock().expectedCallsLeft());
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
}